

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c
# Opt level: O1

sysbvm_tuple_t sysbvm_filesystem_basename(sysbvm_context_t *context,sysbvm_tuple_t path)

{
  char *pcVar1;
  sysbvm_tuple_t sVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  
  bVar6 = (path & 0xf) != 0;
  if ((!bVar6 && path != 0) && ((*(uint *)(path + 8) & 0x300) == 0x200)) {
    if (bVar6 || path == 0) {
      uVar5 = 0;
    }
    else {
      uVar5 = (ulong)*(uint *)(path + 0xc);
    }
    if (uVar5 == 0) {
      uVar3 = 0;
    }
    else {
      uVar4 = 0;
      uVar3 = 0;
      do {
        pcVar1 = (char *)(path + 0x10 + uVar4);
        uVar4 = uVar4 + 1;
        if (*pcVar1 == '/') {
          uVar3 = uVar4;
        }
      } while (uVar5 != uVar4);
    }
    sVar2 = sysbvm_string_createWithString(context,uVar5 - uVar3,(char *)(path + 0x10 + uVar3));
    return sVar2;
  }
  return path;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_filesystem_basename(sysbvm_context_t *context, sysbvm_tuple_t path)
{
    if(!sysbvm_tuple_isBytes(path))
        return path;

    size_t pathSize = sysbvm_tuple_getSizeInBytes(path);
    uint8_t *pathBytes = SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(path)->bytes;
    size_t dirnameEnd = 0;
    for(size_t i = 0; i < pathSize; ++i)
    {
        char separator = pathBytes[i];
        if(separator == '/')
            dirnameEnd = i + 1;
#ifdef _WIN32
        else if(separator == '\\')
            dirnameEnd = i + 1;
#endif
    }

    return sysbvm_string_createWithString(context, pathSize - dirnameEnd, (const char*)(pathBytes + dirnameEnd));
}